

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

TSpellCorrector * __thiscall
NJamSpell::TSpellCorrector::FixFragmentNormalized(TSpellCorrector *this,wstring *text)

{
  wchar_t *pwVar1;
  pointer pTVar2;
  pointer pTVar3;
  reference __x;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  wstring *in_RDX;
  allocator local_f1;
  wstring local_f0 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0 [32];
  undefined1 local_b0 [8];
  TWords candidates;
  size_t i_1;
  TWords words;
  size_t i;
  undefined1 local_68 [8];
  TSentences sentences;
  wstring local_40 [8];
  wstring lowered;
  wstring *text_local;
  TSpellCorrector *this_local;
  wstring *result;
  
  std::__cxx11::wstring::wstring(local_40,in_RDX);
  ToLower((wstring *)local_40);
  TLangModel::Tokenize((TSentences *)local_68,(TLangModel *)text,(wstring *)local_40);
  std::__cxx11::wstring::wstring((wstring *)this);
  for (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar2 = words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,
      pTVar3 = (pointer)std::
                        vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ::size((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                *)local_68), pTVar2 < pTVar3;
      words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(words.
                             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->Ptr + 1)) {
    __x = std::
          vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
          ::operator[]((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        *)local_68,
                       (size_type)
                       words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1,__x);
    for (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar2 = candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        pTVar3 = (pointer)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                                    ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                                     &i_1), pTVar2 < pTVar3;
        candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(candidates.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->Ptr + 1)) {
      GetCandidatesRaw((TWords *)local_b0,(TSpellCorrector *)text,(TWords *)&i_1,
                       (size_t)candidates.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                        ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_b0);
      if (sVar4 != 0) {
        pvVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                           ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_b0,
                            0);
        pvVar6 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                           ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1,
                            (size_type)
                            candidates.
                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar6->Ptr = pvVar5->Ptr;
        pvVar6->Len = pvVar5->Len;
      }
      pvVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1,
                          (size_type)
                          candidates.
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      pwVar1 = pvVar5->Ptr;
      pvVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1,
                          (size_type)
                          candidates.
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar7 = pvVar5->Len;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_f0,pwVar1,uVar7,&local_f1);
      std::operator+(local_d0,(wchar_t *)local_f0);
      std::__cxx11::wstring::operator+=((wstring *)this,(wstring *)local_d0);
      std::__cxx11::wstring::~wstring((wstring *)local_d0);
      std::__cxx11::wstring::~wstring(local_f0);
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_f1);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_b0);
    }
    sVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1);
    if (sVar4 != 0) {
      std::__cxx11::wstring::size();
      std::__cxx11::wstring::resize((ulong)this);
      std::__cxx11::wstring::operator+=((wstring *)this,L". ");
    }
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i_1);
  }
  uVar7 = std::__cxx11::wstring::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::wstring::size();
    std::__cxx11::wstring::resize((ulong)this);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_68);
  std::__cxx11::wstring::~wstring(local_40);
  return this;
}

Assistant:

std::wstring TSpellCorrector::FixFragmentNormalized(const std::wstring& text) const {
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        for (size_t i = 0; i < words.size(); ++i) {
            TWords candidates = GetCandidatesRaw(words, i);
            if (candidates.size() > 0) {
                words[i] = candidates[0];
            }
            result += std::wstring(words[i].Ptr, words[i].Len) + L" ";
        }
        if (words.size() > 0) {
            result.resize(result.size() - 1);
            result += L". ";
        }
    }
    if (!result.empty()) {
        result.resize(result.size() - 1);
    }
    return result;
}